

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O3

void __thiscall sfc::Image::blit(Image *this,rgba_vec_t *rgba_data,uint x,uint y,uint width)

{
  pointer puVar1;
  uint uVar2;
  pointer puVar3;
  pointer puVar4;
  ulong uVar5;
  uint local_3c;
  _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
  *local_38;
  
  puVar3 = (rgba_data->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar4 = (rgba_data->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar4 != puVar3) {
    local_38 = (_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                *)&this->_colors;
    uVar5 = 0;
    do {
      local_3c = puVar3[uVar5];
      uVar2 = (((int)(uVar5 / width) + y) * this->_width + (int)(uVar5 % (ulong)width) + x) * 4;
      puVar1 = (this->_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((ulong)uVar2 + 3 <=
          (ulong)((long)(this->_data).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)puVar1)) {
        puVar1[uVar2] = (uchar)local_3c;
        (this->_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start[(ulong)uVar2 + 1] = (uchar)(local_3c >> 8);
        (this->_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start[(ulong)uVar2 + 2] = (uchar)(local_3c >> 0x10);
        (this->_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start[(ulong)uVar2 + 3] = (uchar)(local_3c >> 0x18);
        std::
        _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
        ::_M_insert_unique<unsigned_int_const&>(local_38,&local_3c);
        puVar3 = (rgba_data->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                 _M_impl.super__Vector_impl_data._M_start;
        puVar4 = (rgba_data->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
      }
      uVar5 = (ulong)((int)uVar5 + 1);
    } while (uVar5 < (ulong)((long)puVar4 - (long)puVar3 >> 2));
  }
  return;
}

Assistant:

void Image::blit(const rgba_vec_t& rgba_data, const unsigned x, const unsigned y, const unsigned width) {
  for (unsigned i = 0; i < rgba_data.size(); ++i)
    set_pixel(rgba_data[i], (i % width) + x, (i / width) + y);
}